

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O1

void motzkin(int n,int *a)

{
  int *piVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  int *piVar5;
  ulong uVar6;
  
  if ((-1 < n) && (*a = 1, n != 0)) {
    piVar1 = a + -1;
    uVar2 = 1;
    uVar3 = 0;
    do {
      a[uVar2] = a[uVar2 - 1];
      if (1 < uVar2) {
        iVar4 = a[uVar2];
        uVar6 = 0;
        piVar5 = piVar1;
        do {
          iVar4 = iVar4 + *piVar5 * a[uVar6];
          a[uVar2] = iVar4;
          uVar6 = uVar6 + 1;
          piVar5 = piVar5 + -1;
        } while (uVar3 != uVar6);
      }
      uVar2 = uVar2 + 1;
      uVar3 = uVar3 + 1;
      piVar1 = piVar1 + 1;
    } while (uVar3 != (uint)n);
  }
  return;
}

Assistant:

void motzkin ( int n, int a[] )

//****************************************************************************80
//
//  Purpose:
//
//    MOTZKIN returns the Motzkin numbers up to order N.
//
//  Discussion:
//
//    The Motzkin number A(N) counts the number of distinct paths
//    from (0,0) to (0,N) in which the only steps used are
//    (1,1), (1,-1) and (1,0), and the path is never allowed to
//    go below the X axis.
//
//  First values:
//
//     N  A(N)
//
//     0    1
//     1    1
//     2    2
//     3    4
//     4    9
//     5   21
//     6   51
//     7  127
//     8  323
//     9  835
//    10 2188
//
//  Recursion:
//
//    A(N) = A(N-1) + sum ( 0 <= K <= N-2 ) A(K) * A(N-2-K)
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    05 August 2004
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Eric Weisstein,
//    CRC Concise Encyclopedia of Mathematics,
//    CRC Press, 2002,
//    Second edition,
//    ISBN: 1584883472,
//    LC: QA5.W45.
//
//  Parameters:
//
//    Input, int N, the highest order Motzkin number to compute.
//
//    Output, int A[N+1], the Motzkin numbers.
//
{
  int i;
  int j;

  if ( n < 0 )
  {
    return;
  }

  a[0] = 1;

  for ( i = 1; i <= n; i++ )
  {
    a[i] = a[i-1];
    for ( j = 0; j <= i-2; j++ )
    {
      a[i] = a[i] + a[j] * a[i-2-j];
    }
  }

  return;
}